

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O3

void __thiscall
ChunkedSequenceResize_TwoElementsDownToZero_Test::~ChunkedSequenceResize_TwoElementsDownToZero_Test
          (ChunkedSequenceResize_TwoElementsDownToZero_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ChunkedSequenceResize, TwoElementsDownToZero) {
    cseq_int cs;
    cs.emplace_back (17);
    cs.emplace_back (19);
    // Before: [ 17, 19 ]
    EXPECT_EQ (cs.chunks_size (), 1U);
    // After: [ _, _ ]
    cs.resize (0U);
    EXPECT_EQ (cs.chunks_size (), 1U);
    EXPECT_EQ (cs.size (), 0U);
    EXPECT_EQ (std::distance (std::begin (cs), std::end (cs)), 0U);
    EXPECT_EQ (cs.capacity (), 2U) << "There is always at least one chunk";
}